

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

int __thiscall TPZCheckMesh::CheckConnectOrderConsistency(TPZCheckMesh *this)

{
  int64_t iVar1;
  bool bVar2;
  int nstate;
  int iVar3;
  int iVar4;
  TPZCompEl **ppTVar5;
  long *plVar6;
  TPZConnect *this_00;
  ulong unaff_R12;
  uint uVar7;
  int iVar8;
  ulong nelem;
  
  iVar1 = (this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  nstate = (**(code **)(*(long *)(this->fMesh->fMaterialVec)._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_left[1]._M_parent + 0x78))();
  uVar7 = (uint)iVar1;
  if (0 < (int)uVar7) {
    nelem = 0;
    do {
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if (*ppTVar5 == (TPZCompEl *)0x0) {
        bVar2 = false;
      }
      else {
        plVar6 = (long *)__dynamic_cast(*ppTVar5,&TPZCompEl::typeinfo,
                                        &TPZInterpolatedElement::typeinfo,0);
        iVar3 = (**(code **)(*plVar6 + 0x380))(plVar6);
        if (iVar3 == 0) {
          (**(code **)(*plVar6 + 200))(plVar6,&std::cout);
          bVar2 = true;
          unaff_R12 = nelem & 0xffffffff;
        }
        else {
          iVar3 = (**(code **)(*plVar6 + 0x90))(plVar6);
          if (iVar3 < 1) {
            bVar2 = false;
          }
          else {
            iVar8 = 0;
            do {
              this_00 = (TPZConnect *)(**(code **)(*plVar6 + 0xa8))(plVar6,iVar8);
              iVar4 = (**(code **)(*plVar6 + 0x260))
                                (plVar6,iVar8,(this_00->field_2).fCompose.fOrder);
              iVar4 = TPZConnect::CheckDependency(this_00,iVar4,this->fMesh,nstate);
              if (iVar4 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TPZCheckMesh inconsistent dependency",0x24);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
                std::ostream::put(-0x58);
                std::ostream::flush();
                (**(code **)(*plVar6 + 200))(plVar6,&std::cout);
                unaff_R12 = nelem & 0xffffffff;
                bVar2 = true;
                goto LAB_010df1a5;
              }
              iVar8 = iVar8 + 1;
            } while (iVar3 != iVar8);
            bVar2 = false;
          }
        }
      }
LAB_010df1a5:
      if (bVar2) {
        return (int)unaff_R12;
      }
      nelem = nelem + 1;
    } while (nelem != (uVar7 & 0x7fffffff));
  }
  return -1;
}

Assistant:

int TPZCheckMesh::CheckConnectOrderConsistency() {
	
	int nel = fMesh->ElementVec().NElements();
	int nstate = (fMesh->MaterialVec().begin()->second)->NStateVariables();
	int iel;
	for(iel = 0; iel<nel; iel++) {
		TPZCompEl *cel = fMesh->ElementVec()[iel];
		if(!cel) continue;
		TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
		if(!intel->CheckElementConsistency()) {
			intel->Print();
			return iel;
		}
		int nc = intel->NConnects();
		int ic;
		for(ic = 0; ic<nc; ic++) {
			TPZConnect &c = intel->Connect(ic);
			int nshape = intel->NConnectShapeF(ic,c.Order());
			if(c.CheckDependency(nshape, fMesh, nstate) == -1) {
				cout << "TPZCheckMesh inconsistent dependency" << endl;
				intel->Print();
				return iel;
			}
		}
	}
	return -1;
}